

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

void CameraMoveUp(Camera *camera,float distance)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = (camera->up).x;
  fVar4 = (camera->up).y;
  fVar8 = (camera->up).z;
  fVar7 = fVar8 * fVar8 + fVar1 * fVar1 + fVar4 * fVar4;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    fVar7 = 1.0 / fVar7;
    fVar1 = fVar1 * fVar7;
    fVar4 = fVar4 * fVar7;
    fVar8 = fVar8 * fVar7;
  }
  uVar2 = (camera->position).x;
  uVar5 = (camera->position).y;
  uVar3 = (camera->target).x;
  uVar6 = (camera->target).y;
  (camera->position).x = fVar1 * distance + (float)uVar2;
  (camera->position).y = (float)uVar5 + fVar4 * distance;
  (camera->position).z = (camera->position).z + fVar8 * distance;
  (camera->target).x = fVar1 * distance + (float)uVar3;
  (camera->target).y = (float)uVar6 + fVar4 * distance;
  (camera->target).z = fVar8 * distance + (camera->target).z;
  return;
}

Assistant:

void CameraMoveUp(Camera *camera, float distance)
{
    Vector3 up = GetCameraUp(camera);

    // Scale by distance
    up = Vector3Scale(up, distance);

    // Move position and target
    camera->position = Vector3Add(camera->position, up);
    camera->target = Vector3Add(camera->target, up);
}